

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

int read_cached_features(vw *all,v_array<example_*> *examples)

{
  example *peVar1;
  bool bVar2;
  vw_ostream *pvVar3;
  ulong *puVar4;
  size_t sVar5;
  size_t sVar6;
  ostream *poVar7;
  ulong uVar8;
  byte bVar9;
  char cVar10;
  int iVar11;
  ulong *puVar12;
  byte bVar13;
  ulong uVar14;
  feature_index i;
  features *this;
  io_buf *cache;
  feature_value v;
  char *c;
  byte local_69;
  ulong *local_68;
  io_buf *local_60;
  size_t local_58;
  example *local_50;
  vw_ostream *local_48;
  features *local_40;
  vw *local_38;
  
  peVar1 = *examples->_begin;
  peVar1->sorted = all->p->sorted_cache;
  cache = all->p->input;
  sVar5 = (*(all->p->lp).read_cached_label)(all->sd,&peVar1->l,cache);
  iVar11 = 0;
  if ((sVar5 != 0) && (sVar6 = read_cached_tag(cache,peVar1), sVar6 != 0)) {
    sVar6 = io_buf::buf_read(cache,(char **)&local_68,1);
    if (sVar6 == 0) {
LAB_00230b0c:
      iVar11 = 0;
    }
    else {
      cVar10 = (char)*local_68;
      local_68 = (ulong *)((long)local_68 + 1);
      all->p->input->head = (char *)local_68;
      local_58 = sVar5;
      if (cVar10 != '\0') {
        local_40 = (peVar1->super_example_predict).feature_space;
        local_48 = &all->trace_message;
        local_60 = cache;
        local_50 = peVar1;
        local_38 = all;
        do {
          sVar5 = io_buf::buf_read(cache,(char **)&local_68,9);
          pvVar3 = local_48;
          if (sVar5 < 9) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&local_48->super_ostream,"truncated example! ",0x13);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            bVar2 = false;
          }
          else {
            local_69 = (byte)*local_68;
            uVar8 = (ulong)local_69;
            local_68 = (ulong *)((long)local_68 + 1);
            v_array<unsigned_char>::push_back((v_array<unsigned_char> *)local_50,&local_69);
            uVar14 = *local_68;
            local_68 = local_68 + 1;
            all->p->input->head = (char *)local_68;
            local_58 = local_58 + uVar14;
            sVar5 = io_buf::buf_read(cache,(char **)&local_68,uVar14);
            pvVar3 = local_48;
            peVar1 = local_50;
            cache = local_60;
            if (sVar5 < uVar14) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_48->super_ostream,"truncated example! wanted: ",0x1b);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," bytes",6);
              std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              bVar2 = false;
              cache = local_60;
            }
            else {
              if (uVar14 != 0) {
                this = local_40 + uVar8;
                puVar12 = (ulong *)(uVar14 + (long)local_68);
                i = 0;
                do {
                  bVar13 = (byte)*local_68;
                  if ((char)bVar13 < '\0') {
                    bVar9 = 0;
                    uVar14 = 0;
                    do {
                      uVar14 = uVar14 | (ulong)(bVar13 & 0x7f) << (bVar9 & 0x3f);
                      bVar13 = *(byte *)((long)local_68 + 1);
                      local_68 = (ulong *)((long)local_68 + 1);
                      bVar9 = bVar9 + 7;
                    } while ((char)bVar13 < '\0');
                  }
                  else {
                    uVar14 = 0;
                    bVar9 = 0;
                  }
                  uVar14 = (ulong)bVar13 << (bVar9 & 0x3f) | uVar14;
                  v = -1.0;
                  puVar4 = (ulong *)((long)local_68 + 1);
                  if (((uVar14 & 1) == 0) && (v = 1.0, (uVar14 & 2) != 0)) {
                    v = *(feature_value *)((long)local_68 + 1);
                    puVar4 = (ulong *)((long)local_68 + 5);
                  }
                  local_68 = puVar4;
                  uVar8 = (long)(uVar14 << 0x3d) >> 0x3f;
                  if ((long)uVar8 < 0) {
                    peVar1->sorted = false;
                  }
                  i = i + (uVar8 ^ uVar14 >> 3);
                  features::push_back(this,v,i);
                } while (local_68 != puVar12);
              }
              local_38->p->input->head = (char *)local_68;
              bVar2 = true;
              all = local_38;
            }
          }
          if (!bVar2) goto LAB_00230b0c;
          cVar10 = cVar10 + -1;
        } while (cVar10 != '\0');
      }
      iVar11 = (int)local_58;
    }
  }
  return iVar11;
}

Assistant:

int read_cached_features(vw* all, v_array<example*>& examples)
{
  example* ae = examples[0];
  ae->sorted = all->p->sorted_cache;
  io_buf* input = all->p->input;

  size_t total = all->p->lp.read_cached_label(all->sd, &ae->l, *input);
  if (total == 0)
    return 0;
  if (read_cached_tag(*input, ae) == 0)
    return 0;
  char* c;
  unsigned char num_indices = 0;
  if (input->buf_read(c, sizeof(num_indices)) < sizeof(num_indices))
    return 0;
  num_indices = *(unsigned char*)c;
  c += sizeof(num_indices);

  all->p->input->set(c);
  for (; num_indices > 0; num_indices--)
  {
    size_t temp;
    unsigned char index = 0;
    if ((temp = input->buf_read(c, sizeof(index) + sizeof(size_t))) < sizeof(index) + sizeof(size_t))
    {
      all->trace_message << "truncated example! " << temp << " " << char_size + sizeof(size_t) << endl;
      return 0;
    }

    index = *(unsigned char*)c;
    c += sizeof(index);
    ae->indices.push_back((size_t)index);
    features& ours = ae->feature_space[index];
    size_t storage = *(size_t*)c;
    c += sizeof(size_t);
    all->p->input->set(c);
    total += storage;
    if (input->buf_read(c, storage) < storage)
    {
      all->trace_message << "truncated example! wanted: " << storage << " bytes" << endl;
      return 0;
    }

    char* end = c + storage;

    uint64_t last = 0;

    for (; c != end;)
    {
      feature_index i = 0;
      c = run_len_decode(c, i);
      feature_value v = 1.f;
      if (i & neg_1)
        v = -1.;
      else if (i & general)
      {
        v = ((one_float*)c)->f;
        c += sizeof(float);
      }
      uint64_t diff = i >> 2;
      int64_t s_diff = ZigZagDecode(diff);
      if (s_diff < 0)
        ae->sorted = false;
      i = last + s_diff;
      last = i;
      ours.push_back(v, i);
    }
    all->p->input->set(c);
  }

  return (int)total;
}